

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O3

int Test_SUNLinSolSetZeroGuess(SUNLinearSolver S,int myid)

{
  uint uVar1;
  
  uVar1 = SUNLinSolSetZeroGuess(S,1);
  if (uVar1 == 0) {
    if (myid == 0) {
      puts("    PASSED test -- SUNLinSolSetZeroGuess ");
      if (print_time != 0) {
        printf("    SUNLinSolSetZeroGuess Time: %22.15e \n \n",0);
      }
      uVar1 = SUNLinSolSetZeroGuess(S,0);
      if (uVar1 == 0) {
        puts("    PASSED test -- SUNLinSolSetZeroGuess ");
        if (print_time == 0) {
          return 0;
        }
        printf("    SUNLinSolSetZeroGuess Time: %22.15e \n \n",0);
        return 0;
      }
    }
    else {
      uVar1 = SUNLinSolSetZeroGuess(S,0);
      if (uVar1 == 0) {
        return 0;
      }
    }
    printf(">>> FAILED test -- SUNLinSolSetZeroGuess returned %d on Proc %d \n",(ulong)uVar1,myid);
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSetZeroGuess returned %d on Proc %d \n",(ulong)uVar1,myid);
  }
  return 1;
}

Assistant:

int Test_SUNLinSolSetZeroGuess(SUNLinearSolver S, int myid)
{
  int failure;
  double start_time, stop_time;

  /* try calling SetZeroGuess routine: should pass/fail based on expected input */
  start_time = get_time();
  failure    = SUNLinSolSetZeroGuess(S, SUNTRUE);
  stop_time  = get_time();

  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSetZeroGuess returned %d on Proc %d \n",
           failure, myid);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolSetZeroGuess \n");
    PRINT_TIME("    SUNLinSolSetZeroGuess Time: %22.15e \n \n",
               stop_time - start_time);
  }

  /* try calling SetZeroGuess routine: should pass/fail based on expected input */
  start_time = get_time();
  failure    = SUNLinSolSetZeroGuess(S, SUNFALSE);
  stop_time  = get_time();

  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSetZeroGuess returned %d on Proc %d \n",
           failure, myid);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolSetZeroGuess \n");
    PRINT_TIME("    SUNLinSolSetZeroGuess Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}